

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedatabase.cpp
# Opt level: O2

bool __thiscall
QMimeDatabasePrivate::inherits(QMimeDatabasePrivate *this,QString *mime,QString *parent)

{
  qsizetype qVar1;
  bool bVar2;
  reference pQVar3;
  QString *nameOrAlias;
  long lVar4;
  long in_FS_OFFSET;
  QDuplicateTracker<QString,_32UL> seen;
  QArrayDataPointer<char16_t> local_758;
  QArrayDataPointer<QString> local_738;
  QArrayDataPointer<char16_t> local_718;
  QArrayDataPointer<QString> local_6f8;
  QArrayDataPointer<char16_t> local_6d8;
  QDuplicateTracker<QString,_32UL> local_6c0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_6d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_6d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_6d8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  resolveAlias((QString *)&local_6d8,this,parent);
  memcpy(&local_6c0,&DAT_00541aa8,0x688);
  QDuplicateTracker<QString,_32UL>::QDuplicateTracker(&local_6c0);
  local_6f8.d = (Data *)0x0;
  local_6f8.ptr = (QString *)0x0;
  local_6f8.size = 0;
  QList<QString>::emplaceBack<QString_const&>((QList<QString> *)&local_6f8,mime);
  while( true ) {
    qVar1 = local_6f8.size;
    if (local_6f8.size == 0) break;
    pQVar3 = std::stack<QString,_QList<QString>_>::top
                       ((stack<QString,_QList<QString>_> *)&local_6f8);
    bVar2 = ::comparesEqual(pQVar3,(QString *)&local_6d8);
    if (bVar2) break;
    local_718.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_718.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_718.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = std::stack<QString,_QList<QString>_>::top
                       ((stack<QString,_QList<QString>_> *)&local_6f8);
    local_718.d = (pQVar3->d).d;
    local_718.ptr = (pQVar3->d).ptr;
    local_718.size = (pQVar3->d).size;
    if (local_718.d != (Data *)0x0) {
      LOCK();
      ((local_718.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_718.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    std::stack<QString,_QList<QString>_>::pop((stack<QString,_QList<QString>_> *)&local_6f8);
    local_738.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_738.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_738.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    parents((QStringList *)&local_738,this,(QString *)&local_718);
    nameOrAlias = local_738.ptr;
    for (lVar4 = local_738.size * 0x18; lVar4 != 0; lVar4 = lVar4 + -0x18) {
      local_758.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_758.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_758.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      resolveAlias((QString *)&local_758,this,nameOrAlias);
      bVar2 = QDuplicateTracker<QString,_32UL>::hasSeen(&local_6c0,(QString *)&local_758);
      if (!bVar2) {
        QList<QString>::emplaceBack<QString_const&>
                  ((QList<QString> *)&local_6f8,(QString *)&local_758);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_758);
      nameOrAlias = nameOrAlias + 1;
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_738);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_718);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_6f8);
  QDuplicateTracker<QString,_32UL>::~QDuplicateTracker(&local_6c0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_6d8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return qVar1 != 0;
  }
  __stack_chk_fail();
}

Assistant:

bool QMimeDatabasePrivate::inherits(const QString &mime, const QString &parent)
{
    const QString resolvedParent = resolveAlias(parent);
    QDuplicateTracker<QString> seen;
    std::stack<QString, QStringList> toCheck;
    toCheck.push(mime);
    while (!toCheck.empty()) {
        if (toCheck.top() == resolvedParent)
            return true;
        const QString mimeName = toCheck.top();
        toCheck.pop();
        const auto parentList = parents(mimeName);
        for (const QString &par : parentList) {
            const QString resolvedPar = resolveAlias(par);
            if (!seen.hasSeen(resolvedPar))
                toCheck.push(resolvedPar);
        }
    }
    return false;
}